

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::all2allv<int>(int *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
                       int *out,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
                       comm *comm)

{
  allocator<int> *paVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  int iVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  unsigned_long *puVar7;
  MPI_Datatype poVar8;
  MPI_Comm poVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  MPI_Datatype poVar14;
  undefined1 local_148 [8];
  datatype dt;
  vector<int,_std::allocator<int>_> recv_displs;
  vector<int,_std::allocator<int>_> send_displs;
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> recv_counts;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> send_counts;
  ulong local_90;
  size_t max;
  datatype mpi_sizet;
  size_t local_max_size;
  unsigned_long local_58;
  size_t total_recv_size;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  unsigned_long local_40;
  size_t total_send_size;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  int *out_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes_local;
  int *msgs_local;
  
  total_send_size = (size_t)comm;
  comm_local = (comm *)recv_sizes;
  recv_sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)out;
  out_local = (int *)send_sizes;
  send_sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs;
  local_48._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(send_sizes);
  total_recv_size =
       (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
  iVar4 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    (local_48,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )total_recv_size,0);
  local_40 = (unsigned_long)iVar4;
  cVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local);
  cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local);
  iVar4 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )cVar5._M_current,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )cVar6._M_current,0);
  local_58 = (unsigned_long)iVar4;
  puVar7 = std::max<unsigned_long>(&local_40,&local_58);
  mpi_sizet._16_8_ = *puVar7;
  get_datatype<unsigned_long>();
  poVar8 = datatype::type((datatype *)&max);
  poVar9 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)total_send_size);
  MPI_Allreduce(&mpi_sizet.builtin,&local_90,1,poVar8,&ompi_mpi_op_max,poVar9);
  if (local_90 < 0x7fffffff) {
    cVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
    cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
    paVar1 = (allocator<int> *)
             ((long)&recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)local_b8,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )cVar5._M_current,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )cVar6._M_current,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    cVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local);
    cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local);
    paVar1 = (allocator<int> *)
             ((long)&send_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)local_e8,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )cVar5._M_current,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )cVar6._M_current,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&send_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    impl::get_displacements<int>
              ((vector<int,_std::allocator<int>_> *)
               &recv_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<int,_std::allocator<int>_> *)local_b8);
    impl::get_displacements<int>
              ((vector<int,_std::allocator<int>_> *)&dt.builtin,
               (vector<int,_std::allocator<int>_> *)local_e8);
    get_datatype<int>();
    pvVar3 = send_sizes_local;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_b8,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &recv_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    poVar8 = datatype::type((datatype *)local_148);
    pvVar2 = recv_sizes_local;
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_e8,0);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&dt.builtin,0);
    poVar14 = datatype::type((datatype *)local_148);
    poVar9 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)total_send_size);
    MPI_Alltoallv(pvVar3,pvVar10,pvVar11,poVar8,pvVar2,pvVar12,pvVar13,poVar14,poVar9);
    datatype::~datatype((datatype *)local_148);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&dt.builtin);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &recv_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8);
  }
  else {
    impl::all2allv_big<int>
              ((int *)send_sizes_local,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local,
               (int *)recv_sizes_local,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local,
               (comm *)total_send_size);
  }
  datatype::~datatype((datatype *)&max);
  return;
}

Assistant:

void all2allv(const T* msgs, const std::vector<size_t>& send_sizes, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_send_size = std::accumulate(send_sizes.begin(), send_sizes.end(), 0);
    size_t total_recv_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    size_t local_max_size = std::max(total_send_size, total_recv_size);
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    size_t max;
    MPI_Allreduce(&local_max_size, &max, 1, mpi_sizet.type(), MPI_MAX, comm);
    if (max >= mxx::max_int) {
        impl::all2allv_big(msgs, send_sizes, out, recv_sizes, comm);
    } else {
        // convert vectors to integer counts
        std::vector<int> send_counts(send_sizes.begin(), send_sizes.end());
        std::vector<int> recv_counts(recv_sizes.begin(), recv_sizes.end());
        // get displacements
        std::vector<int> send_displs = impl::get_displacements(send_counts);
        std::vector<int> recv_displs = impl::get_displacements(recv_counts);
        // call regular alltoallv
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Alltoallv(const_cast<T*>(msgs), &send_counts[0], &send_displs[0], dt.type(),
                      out, &recv_counts[0], &recv_displs[0], dt.type(), comm);
    }
}